

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license-generator.cpp
# Opt level: O1

void license::LicenseGenerator::generateAndOutputLicenses(variables_map *vm,ostream *outputFile)

{
  pointer *__ptr;
  pointer this;
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> helper;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenseInfo;
  string license;
  string signature;
  char pkey [888];
  long *local_408;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> local_400;
  string local_3e8;
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [888];
  
  parseLicenseInfo(&local_400,vm);
  CryptoHelper::getInstance();
  memcpy(local_3a8,
         "-----BEGIN RSA PRIVATE KEY-----\nMIICXQIBAAKBgQDWwLNwQ5Sp5q7mwB3UbT8d3zVb1X/DMPGIf9zilT4TfimZIttz\nDFJ1TJVekAV0Nq3/8k/SajYbxxCHimYUmu3zSE6eYFE0fJe2MRVrCdlO04XY4L2m\nbxaC1XokCtB0yUO8I+qWWKExOyB8yGtCBLe4OohnquzewvqJpYZOi49s6wIDAQAB\nAoGBAJFugpY+TgkZPczqwcjACwRRyrLcTN+E360O2ilf5GATCly4bGDnMVhaerVF\nV0wyU3eHQ2M9plL9ZkZEBYliukzPD0Fv0gqJJ7OnuDqniNqGAP3trAVpI0uQL5BK\nsBZqHH2H5kSXHxfPiEn/qr+HPJGQLtxDhiw6obqInz/Uj+PRAkEA9CR/7BngVmM8\nx7yV2VuvSkbjxWLQ35RkAgbYeK9f1j96QLjgRbiCb5Atni9xePdu4LexY0gHfJ0R\nUmboBZijdQJBAOEuycuJZS5q2e1Ar3G+CoGld/VPBsRxoZGeRr9Kkjs6YyfY6glV\n79UsPD7v1IyO31E08pPQoj/zg8czhFtlot8CQHr+SFOxVYsvw1b8cqFlxxEsVWMD\nPSblotxChpuF/kn5AKXKfXGiWlPJ1rFyRUAjpwAeiobxqpPkrO1OWmU3WGECQGsy\n2fAiTV/GkE5o79ynCttjSXMnluIn8jGfdrCUMH8vsYqDsg6VsaH6+AdCJx5u2ZMQ\nMLb7qHHnXIGVXdogzWMCQQCu/F8hcrvD+mkJTspn6PBLwLcVOH7M+JiGHB9mu1eW\nZ8CJ/NLl2WQ8z2qQTXMAi5JvkZj66OJptI5Bs07Qn+IT\n-----END RSA PRIVATE KEY-----\n"
         ,0x378);
  if (local_400.
      super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_400.
      super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this = local_400.
           super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
    do {
      FullLicenseInfo::printForSign_abi_cxx11_(&local_3e8,this);
      (**(code **)(*local_408 + 0x18))(local_3c8,local_408,local_3a8,0x378,&local_3e8);
      std::__cxx11::string::_M_assign((string *)&this->license_signature);
      FullLicenseInfo::printAsIni(this,outputFile);
      if (local_3c8[0] != local_3b8) {
        operator_delete(local_3c8[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p);
      }
      this = this + 1;
    } while (this != local_400.
                     super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_408 != (long *)0x0) {
    (**(code **)(*local_408 + 0x28))();
  }
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
            (&local_400);
  return;
}

Assistant:

void LicenseGenerator::generateAndOutputLicenses(const po::variables_map& vm,
		ostream& outputFile) {
	vector<FullLicenseInfo> licenseInfo = parseLicenseInfo(vm);
	unique_ptr<CryptoHelper> helper = CryptoHelper::getInstance();
	const char pkey[] = PRIVATE_KEY;
	size_t len = sizeof(pkey);
	for (auto it = licenseInfo.begin(); it != licenseInfo.end(); ++it) {
		const string license = it->printForSign();
		string signature = helper->signString((const void *)pkey,len,license);
		it->license_signature = signature;
		it->printAsIni(outputFile);
	}
}